

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

void swrenderer::R_HighlightPortal(PortalDrawseg *pds)

{
  BYTE *pBVar1;
  short *psVar2;
  short *psVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  _func_int **pp_Var7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  byte local_3c;
  
  iVar4 = BestColor((uint32 *)&GPalette,0xff,0,0,0,0xff);
  uVar14 = (ulong)pds->x1;
  iVar5 = pds->x2;
  if (pds->x1 < iVar5) {
    pBVar1 = RenderTarget->Buffer;
    local_3c = (byte)iVar4;
    do {
      uVar13 = (uint)uVar14;
      if ((-1 < (int)uVar13) && ((int)uVar13 < RenderTarget->Width)) {
        uVar6 = pds->x1;
        psVar2 = (pds->ceilingclip).Array;
        psVar3 = (pds->floorclip).Array;
        uVar10 = (uint)psVar2[uVar14 - (long)(int)uVar6];
        uVar9 = (ulong)uVar10;
        uVar11 = (uint)psVar3[uVar14 - (long)(int)uVar6];
        if (uVar13 == iVar5 - 1U || uVar13 == uVar6) {
          uVar11 = uVar11 + 1;
          pp_Var7 = (RenderTarget->super_DObject)._vptr_DObject;
        }
        else {
          uVar8 = (uint)psVar2[(int)(~uVar6 + uVar13)];
          uVar12 = (uint)psVar3[(int)(~uVar6 + uVar13)];
          uVar6 = uVar10 - uVar8;
          uVar13 = -uVar6;
          if (0 < (int)uVar6) {
            uVar13 = uVar6;
          }
          if (uVar13 < 2) {
            pBVar1[(uVar14 & 0xffffffff) + (long)(int)uVar10 * (long)RenderTarget->Pitch] = local_3c
            ;
          }
          else {
            (*(RenderTarget->super_DObject)._vptr_DObject[0x14])
                      (RenderTarget,uVar14 & 0xffffffff,(ulong)uVar8,uVar14 & 0xffffffff,uVar9,
                       (ulong)local_3c,0);
          }
          uVar6 = uVar11 - uVar12;
          uVar13 = -uVar6;
          if (0 < (int)uVar6) {
            uVar13 = uVar6;
          }
          if (uVar13 < 2) {
            pBVar1[(uVar14 & 0xffffffff) + (long)(int)uVar11 * (long)RenderTarget->Pitch] = local_3c
            ;
            goto LAB_002df2ac;
          }
          pp_Var7 = (RenderTarget->super_DObject)._vptr_DObject;
          uVar9 = (ulong)uVar12;
        }
        (*pp_Var7[0x14])(RenderTarget,uVar14 & 0xffffffff,uVar9,uVar14 & 0xffffffff,(ulong)uVar11,
                         (ulong)local_3c,0);
      }
LAB_002df2ac:
      iVar5 = pds->x2;
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < iVar5);
  }
  return;
}

Assistant:

void R_HighlightPortal (PortalDrawseg* pds)
{
	// [ZZ] NO OVERFLOW CHECKS HERE
	//      I believe it won't break. if it does, blame me. :(

	BYTE color = (BYTE)BestColor((DWORD *)GPalette.BaseColors, 255, 0, 0, 0, 255);

	BYTE* pixels = RenderTarget->GetBuffer();
	// top edge
	for (int x = pds->x1; x < pds->x2; x++)
	{
		if (x < 0 || x >= RenderTarget->GetWidth())
			continue;

		int p = x - pds->x1;
		int Ytop = pds->ceilingclip[p];
		int Ybottom = pds->floorclip[p];

		if (x == pds->x1 || x == pds->x2-1)
		{
			RenderTarget->DrawLine(x, Ytop, x, Ybottom+1, color, 0);
			continue;
		}

		int YtopPrev = pds->ceilingclip[p-1];
		int YbottomPrev = pds->floorclip[p-1];

		if (abs(Ytop-YtopPrev) > 1)
			RenderTarget->DrawLine(x, YtopPrev, x, Ytop, color, 0);
		else *(pixels + Ytop * RenderTarget->GetPitch() + x) = color;

		if (abs(Ybottom-YbottomPrev) > 1)
			RenderTarget->DrawLine(x, YbottomPrev, x, Ybottom, color, 0);
		else *(pixels + Ybottom * RenderTarget->GetPitch() + x) = color;
	}
}